

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

optional<slang::ast::SequenceRange> __thiscall
slang::ast::SimpleAssertionExpr::computeSequenceLengthImpl(SimpleAssertionExpr *this)

{
  SequenceRange res_00;
  bool bVar1;
  SequenceRange *pSVar2;
  AssertionExpr *in_RDI;
  optional<slang::ast::SequenceRange> oVar3;
  optional<slang::ast::SequenceRange> aieSeqLength;
  AssertionInstanceExpression *aie;
  SequenceRange res;
  SequenceRange *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffb4;
  uint32_t in_stack_ffffffffffffffcc;
  _Optional_payload_base<unsigned_int> in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  _Optional_base<slang::ast::SequenceRange,_true,_true> local_10;
  
  SequenceRange::SequenceRange((SequenceRange *)0x9d1760);
  std::optional<unsigned_int>::operator=
            ((optional<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
             ,in_stack_ffffffffffffff88);
  if (**(int **)(in_RDI + 1) == 0x27) {
    in_stack_ffffffffffffffd0 =
         (_Optional_payload_base<unsigned_int>)
         Expression::as<slang::ast::AssertionInstanceExpression>(*(Expression **)(in_RDI + 1));
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9d17b2);
    bVar1 = Type::isSequenceType((Type *)0x9d17ba);
    if (bVar1) {
      oVar3 = AssertionExpr::computeSequenceLength(in_RDI);
      in_stack_ffffffffffffffcc =
           oVar3.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._12_4_;
      bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRange> *)0x9d17e2);
      if (bVar1) {
        pSVar2 = std::optional<slang::ast::SequenceRange>::operator*
                           ((optional<slang::ast::SequenceRange> *)0x9d17f2);
        local_1c = *(undefined4 *)
                    &(pSVar2->max).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_engaged;
      }
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRepetition> *)0x9d1813)
  ;
  if (bVar1) {
    std::optional<slang::ast::SequenceRepetition>::operator->
              ((optional<slang::ast::SequenceRepetition> *)0x9d1827);
    res_00.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)in_stack_ffffffffffffffd0;
    res_00.min = in_stack_ffffffffffffffcc;
    SequenceRepetition::applyTo
              ((SequenceRepetition *)CONCAT44(in_stack_ffffffffffffffb4,local_1c),res_00);
  }
  std::optional<slang::ast::SequenceRange>::optional<slang::ast::SequenceRange,_true>
            ((optional<slang::ast::SequenceRange> *)in_RDI,in_stack_ffffffffffffff78);
  return (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         local_10._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>;
}

Assistant:

std::optional<SequenceRange> SimpleAssertionExpr::computeSequenceLengthImpl() const {
    SequenceRange res;
    res.min = 1;
    res.max = 1;

    if (expr.kind == ExpressionKind::AssertionInstance) {
        if (auto& aie = expr.as<AssertionInstanceExpression>(); aie.type->isSequenceType()) {
            if (auto aieSeqLength = aie.body.computeSequenceLength())
                res = *aieSeqLength;
        }
    }

    if (repetition)
        res = repetition->applyTo(res);

    return res;
}